

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wmb.cpp
# Opt level: O2

void __thiscall merlin::wmb::tighten(wmb *this,size_t nIter,double stopTime,double stopObj)

{
  long lVar1;
  long lVar2;
  double dVar3;
  ostream *poVar4;
  size_t iter;
  ulong iter_00;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"[WMB] Begin message passing over join graph ...");
  std::endl<char,std::char_traits<char>>(poVar4);
  dVar7 = INFINITY;
  for (iter_00 = 1; iter_00 <= nIter; iter_00 = iter_00 + 1) {
    auVar6._8_4_ = (int)(iter_00 >> 0x20);
    auVar6._0_8_ = iter_00;
    auVar6._12_4_ = 0x45300000;
    dVar5 = this->m_logz;
    forward(this,1.0 / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)iter_00) - 4503599627370496.0)));
    backward(this,iter_00);
    update(this);
    dVar8 = this->m_logz;
    dVar3 = dVar8;
    if (dVar7 <= dVar8) {
      dVar3 = dVar7;
    }
    dVar7 = dVar3;
    dVar8 = ABS(dVar8 - dVar5);
    poVar4 = std::operator<<((ostream *)&std::cout,"  logZ: ");
    lVar1 = *(long *)poVar4;
    *(uint *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x18) & 0xfffffefb | 4;
    *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 0xc;
    *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 8) = 6;
    poVar4 = std::ostream::_M_insert<double>(this->m_logz);
    poVar4 = std::operator<<(poVar4," (");
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 8) = 6;
    dVar5 = exp(this->m_logz);
    poVar4 = std::ostream::_M_insert<double>(dVar5);
    std::operator<<(poVar4,") ");
    std::operator<<((ostream *)&std::cout,"\td=");
    poVar4 = std::ostream::_M_insert<double>(dVar8);
    poVar4 = std::operator<<(poVar4,"\t time=");
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xfffffefb | 4;
    *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 8) = 6;
    dVar5 = timeSystem();
    poVar4 = std::ostream::_M_insert<double>(dVar5 - (this->super_algorithm).m_start_time);
    poVar4 = std::operator<<(poVar4,"\ti=");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    if ((dVar8 < stopObj) ||
       ((0.0 < stopTime &&
        (dVar5 = timeSystem(), stopTime <= dVar5 - (this->super_algorithm).m_start_time)))) break;
  }
  this->m_logz = dVar7;
  return;
}

Assistant:

void wmb::tighten(size_t nIter, double stopTime, double stopObj) {
	std::cout << "[WMB] Begin message passing over join graph ..." << std::endl;

	double minZ = infty();
	for (size_t iter = 1; iter <= nIter; ++iter) {
		double step = 1.0/(double)iter;
		double prevZ = m_logz;

		forward(step);
		backward(iter);
		update();

		// keep track of tightest upper bound
		if (m_logz < minZ) {
			minZ = m_logz;
		}

		double dObj = fabs(m_logz - prevZ);
		std::cout << "  logZ: " << std::fixed
				<< std::setw(12) << std::setprecision(MERLIN_PRECISION)
				<< m_logz << " (" << std::scientific
				<< std::setprecision(MERLIN_PRECISION)
				<< std::exp(m_logz) << ") ";
		std::cout << "\td=" << dObj << "\t time="  << std::fixed
			<< std::setprecision(MERLIN_PRECISION) << (timeSystem() - m_start_time)
			<< "\ti=" << iter << std::endl;

		if (dObj < stopObj) {
			break;
		}

		// do at least one iterations
		if (stopTime > 0 && stopTime <= (timeSystem() - m_start_time)) {
			break;
		}
	} // end for

	m_logz = minZ; // keep tightest upper bound
}